

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_decomp_img(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int iVar1;
  int *status_00;
  int *in_RDX;
  int *in_RSI;
  fitsfile *in_RDI;
  bool bVar2;
  double dnulval;
  float fnulval;
  float *nulladdr;
  long memsize;
  long imgsize;
  long inc [6];
  LONGLONG lpixel [6];
  LONGLONG fpixel [6];
  int anynul;
  int nullcheck;
  int byte_per_pix;
  int datatype;
  int ii;
  double *data;
  int in_stack_00000224;
  long *in_stack_00000228;
  LONGLONG *in_stack_00000230;
  LONGLONG *in_stack_00000238;
  int in_stack_00000244;
  fitsfile *in_stack_00000248;
  void *in_stack_00000280;
  void *in_stack_00000288;
  char *in_stack_00000290;
  int *in_stack_00000298;
  int *in_stack_000002a0;
  fitsfile *in_stack_fffffffffffffed8;
  int *in_stack_fffffffffffffee0;
  double in_stack_fffffffffffffee8;
  void *array;
  int *in_stack_fffffffffffffef0;
  int *nelem;
  fitsfile *in_stack_fffffffffffffef8;
  int *firstelem;
  undefined8 in_stack_ffffffffffffff00;
  int datatype_00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int *status_01;
  undefined8 local_d8 [4];
  int *in_stack_ffffffffffffff48;
  fitsfile *in_stack_ffffffffffffff50;
  fitsfile *in_stack_ffffffffffffff58;
  undefined8 local_78 [6];
  int local_44;
  uint local_40;
  int local_3c;
  undefined4 local_38;
  int local_34;
  int *local_30;
  int *local_28;
  int local_c;
  
  local_38 = 0;
  local_3c = 0;
  if (*in_RDX < 1) {
    local_28 = in_RDX;
    iVar1 = fits_is_compressed_image(in_stack_fffffffffffffed8,(int *)0x1f8eae);
    if (iVar1 == 0) {
      ffpmsg((char *)0x1f8ebf);
      *local_28 = 0x19e;
      local_c = 0x19e;
    }
    else {
      iVar1 = ffcrim((fitsfile *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),(int)in_stack_ffffffffffffff00,
                     (long *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      datatype_00 = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
      if (iVar1 < 1) {
        iVar1 = imcomp_copy_imheader
                          (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           in_stack_ffffffffffffff48);
        if (iVar1 < 1) {
          ffrdef(in_RDI,in_RSI);
          ffpscl(in_stack_fffffffffffffef8,(double)in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
          ffpscl(in_stack_fffffffffffffef8,(double)in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
          local_40 = 0;
          if (in_RDI->Fptr->zbitpix == 8) {
            local_38 = 0xb;
            local_3c = 1;
          }
          else if (in_RDI->Fptr->zbitpix == 0x10) {
            local_38 = 0x15;
            local_3c = 2;
          }
          else if (in_RDI->Fptr->zbitpix == 0x20) {
            local_38 = 0x1f;
            local_3c = 4;
          }
          else if (in_RDI->Fptr->zbitpix == -0x20) {
            local_40 = 1;
            in_stack_ffffffffffffff0c = 0x8541f136;
            local_38 = 0x2a;
            local_3c = 4;
          }
          else {
            bVar2 = in_RDI->Fptr->zbitpix == -0x40;
            if (bVar2) {
              datatype_00 = -0x4757c1d8;
              local_38 = 0x52;
              local_3c = 8;
            }
            local_40 = (uint)bVar2;
          }
          status_01 = (int *)0x1;
          for (local_34 = 0; local_34 < in_RDI->Fptr->zndim; local_34 = local_34 + 1) {
            status_01 = (int *)(in_RDI->Fptr->znaxis[local_34] * (long)status_01);
            local_78[local_34] = 1;
            *(long *)(&stack0xffffffffffffff58 + (long)local_34 * 8) =
                 in_RDI->Fptr->znaxis[local_34];
            local_d8[local_34] = 1;
          }
          status_00 = (int *)calloc(((long)status_01 * (long)local_3c - 1U >> 3) + 1,8);
          local_30 = status_00;
          if (status_00 == (int *)0x0) {
            ffpmsg((char *)0x1f9245);
            *local_28 = 0x71;
            local_c = 0x71;
          }
          else {
            nelem = &local_44;
            array = (void *)0x0;
            firstelem = local_28;
            fits_read_compressed_img
                      (in_stack_00000248,in_stack_00000244,in_stack_00000238,in_stack_00000230,
                       in_stack_00000228,in_stack_00000224,in_stack_00000280,in_stack_00000288,
                       in_stack_00000290,in_stack_00000298,in_stack_000002a0);
            if (local_44 == 0) {
              ffppr((fitsfile *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                    datatype_00,(LONGLONG)firstelem,(LONGLONG)nelem,array,status_00);
            }
            else {
              ffppn((fitsfile *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                    datatype_00,(LONGLONG)firstelem,(LONGLONG)nelem,array,status_00,status_01);
            }
            free(local_30);
            local_c = *local_28;
          }
        }
        else {
          ffpmsg((char *)0x1f8f7e);
          local_c = *local_28;
        }
      }
      else {
        ffpmsg((char *)0x1f8f3a);
        local_c = *local_28;
      }
    }
  }
  else {
    local_c = *in_RDX;
  }
  return local_c;
}

Assistant:

int fits_decompress_img (fitsfile *infptr, /* image (bintable) to uncompress */
              fitsfile *outfptr,   /* empty HDU for output uncompressed image */
              int *status)         /* IO - error status               */

/* 
  THIS IS AN OBSOLETE ROUTINE.  USE fits_img_decompress instead!!!
  
  This routine decompresses the whole image and writes it to the output file.
*/

{
    double *data;
    int ii, datatype = 0, byte_per_pix = 0;
    int nullcheck, anynul;
    LONGLONG fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long inc[MAX_COMPRESS_DIM];
    long imgsize, memsize;
    float *nulladdr, fnulval;
    double dnulval;

    if (*status > 0)
        return(*status);

    if (!fits_is_compressed_image(infptr, status) )
    {
        ffpmsg("CHDU is not a compressed image (fits_decompress_img)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    /* create an empty output image with the correct dimensions */
    if (ffcrim(outfptr, (infptr->Fptr)->zbitpix, (infptr->Fptr)->zndim, 
       (infptr->Fptr)->znaxis, status) > 0)
    {
        ffpmsg("error creating output decompressed image HDU");
    	return (*status);
    }
    /* Copy the table header to the image header. */
    if (imcomp_copy_imheader(infptr, outfptr, status) > 0)
    {
        ffpmsg("error copying header of compressed image");
    	return (*status);
    }

    /* force a rescan of the output header keywords, then reset the scaling */
    /* in case the BSCALE and BZERO keywords are present, so that the       */
    /* decompressed values won't be scaled when written to the output image */
    ffrdef(outfptr, status);
    ffpscl(outfptr, 1.0, 0.0, status);
    ffpscl(infptr, 1.0, 0.0, status);

    /* initialize; no null checking is needed for integer images */
    nullcheck = 0;
    nulladdr =  &fnulval;

    /* determine datatype for image */
    if ((infptr->Fptr)->zbitpix == BYTE_IMG)
    {
        datatype = TBYTE;
        byte_per_pix = 1;
    }
    else if ((infptr->Fptr)->zbitpix == SHORT_IMG)
    {
        datatype = TSHORT;
        byte_per_pix = sizeof(short);
    }
    else if ((infptr->Fptr)->zbitpix == LONG_IMG)
    {
        datatype = TINT;
        byte_per_pix = sizeof(int);
    }
    else if ((infptr->Fptr)->zbitpix == FLOAT_IMG)
    {
        /* In the case of float images we must check for NaNs  */
        nullcheck = 1;
        fnulval = FLOATNULLVALUE;
        nulladdr =  &fnulval;
        datatype = TFLOAT;
        byte_per_pix = sizeof(float);
    }
    else if ((infptr->Fptr)->zbitpix == DOUBLE_IMG)
    {
        /* In the case of double images we must check for NaNs  */
        nullcheck = 1;
        dnulval = DOUBLENULLVALUE;
        nulladdr = (float *) &dnulval;
        datatype = TDOUBLE;
        byte_per_pix = sizeof(double);
    }

    /* calculate size of the image (in pixels) */
    imgsize = 1;
    for (ii = 0; ii < (infptr->Fptr)->zndim; ii++)
    {
        imgsize *= (infptr->Fptr)->znaxis[ii];
        fpixel[ii] = 1;              /* Set first and last pixel to */
        lpixel[ii] = (infptr->Fptr)->znaxis[ii]; /* include the entire image. */
        inc[ii] = 1;
    }
    /* Calc equivalent number of double pixels same size as whole the image. */
    /* We use double datatype to force the memory to be aligned properly */
    memsize = ((imgsize * byte_per_pix) - 1) / sizeof(double) + 1;

    /* allocate memory for the image */
    data = (double*) calloc (memsize, sizeof(double));
    if (!data)
    { 
        ffpmsg("Couldn't allocate memory for the uncompressed image");
        return(*status = MEMORY_ALLOCATION);
    }

    /* uncompress the entire image into memory */
    /* This routine should be enhanced sometime to only need enough */
    /* memory to uncompress one tile at a time.  */
    fits_read_compressed_img(infptr, datatype, fpixel, lpixel, inc,  
            nullcheck, nulladdr, data, NULL, &anynul, status);

    /* write the image to the output file */
    if (anynul)
        fits_write_imgnull(outfptr, datatype, 1, imgsize, data, nulladdr, 
                          status);
    else
        fits_write_img(outfptr, datatype, 1, imgsize, data, status);

    free(data);
    return (*status);
}